

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter_impl.h
# Opt level: O0

void lwlog::details::formatter::format_attribute<unsigned_long>
               (string *pattern,flag_pair *flags,unsigned_long value)

{
  char *pcVar1;
  const_pointer pvVar2;
  _If_sv<std::basic_string_view<char>,_size_type> _Var3;
  string *psVar4;
  string_view *verbose;
  undefined1 local_40 [8];
  string str_value;
  unsigned_long value_local;
  flag_pair *flags_local;
  string *pattern_local;
  
  verbose = (string_view *)((long)&str_value.field_2 + 8);
  str_value.field_2._8_8_ = value;
  format_attribute<unsigned_long>(std::__cxx11::string&,lwlog::details::flag_pair_const&,unsigned_long)
  ::{lambda()#1}::operator()[abi_cxx11_((string *)local_40,&verbose);
  while( true ) {
    pcVar1 = (char *)std::__cxx11::string::data();
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&flags->verbose);
    pcVar1 = strstr(pcVar1,pvVar2);
    if (pcVar1 == (char *)0x0) break;
    _Var3 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)pattern,&flags->verbose,0);
    psVar4 = (string *)
             std::basic_string_view<char,_std::char_traits<char>_>::length(&flags->verbose);
    std::__cxx11::string::replace((ulong)pattern,_Var3,psVar4);
  }
  while( true ) {
    pcVar1 = (char *)std::__cxx11::string::data();
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&flags->shortened);
    pcVar1 = strstr(pcVar1,pvVar2);
    if (pcVar1 == (char *)0x0) break;
    _Var3 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)pattern,&flags->shortened,0);
    psVar4 = (string *)
             std::basic_string_view<char,_std::char_traits<char>_>::length(&flags->shortened);
    std::__cxx11::string::replace((ulong)pattern,_Var3,psVar4);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void formatter::format_attribute(std::string& pattern, const flag_pair& flags, T value)
	{
		const std::string str_value = [&value]() {
			if constexpr (std::is_arithmetic_v<T>)					return std::to_string(value);
			else if constexpr (std::is_same_v<T, std::string>)		return value;
			else if constexpr (std::is_same_v<T, std::string_view>)	return value.data();
			else if constexpr (std::is_same_v<T, const char*>)		return value;
			else													return "";
		}();

		const auto& [verbose, shortened] = flags;
		while (std::strstr(pattern.data(), verbose.data()))
		{
			pattern.replace(pattern.find(verbose), verbose.length(), str_value);
		}

		while (std::strstr(pattern.data(), shortened.data()))
		{
			pattern.replace(pattern.find(shortened), shortened.length(), str_value);
		}
	}